

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaZ_fill(ZIO *z)

{
  byte *pbVar1;
  long lVar2;
  long *in_RDI;
  char *buff;
  lua_State *L;
  size_t size;
  long local_18;
  long *local_10;
  uint local_4;
  
  local_10 = in_RDI;
  lVar2 = (*(code *)in_RDI[2])(in_RDI[4],in_RDI[3],&local_18);
  if ((lVar2 == 0) || (local_18 == 0)) {
    local_4 = 0xffffffff;
  }
  else {
    *local_10 = local_18 + -1;
    local_10[1] = lVar2;
    pbVar1 = (byte *)local_10[1];
    local_10[1] = (long)(pbVar1 + 1);
    local_4 = (uint)*pbVar1;
  }
  return local_4;
}

Assistant:

static int luaZ_fill(ZIO*z){
size_t size;
lua_State*L=z->L;
const char*buff;
buff=z->reader(L,z->data,&size);
if(buff==NULL||size==0)return(-1);
z->n=size-1;
z->p=buff;
return char2int(*(z->p++));
}